

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AssertionItemPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AssertionItemPortListSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,
          SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *args_1,Token *args_2)

{
  Token closeParen;
  AssertionItemPortListSyntax *pAVar1;
  SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *in_RDX;
  AssertionItemPortListSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  Token in_stack_00000008;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pAVar1 = (AssertionItemPortListSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  closeParen.info = unaff_retaddr;
  closeParen.kind = (short)in_RDI;
  closeParen._2_1_ = (char)((ulong)in_RDI >> 0x10);
  closeParen.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  closeParen.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::AssertionItemPortListSyntax::AssertionItemPortListSyntax
            (in_RSI,in_stack_00000008,in_RDX,closeParen);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }